

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-a64.c
# Opt level: O0

void disas_simd_copy(DisasContext_conflict1 *s,uint32_t insn)

{
  uint32_t rd_00;
  uint32_t rn_00;
  uint32_t imm4_00;
  uint32_t uVar1;
  uint32_t is_q_00;
  uint32_t imm5_00;
  int imm5;
  int is_q;
  int op;
  int imm4;
  int rn;
  int rd;
  uint32_t insn_local;
  DisasContext_conflict1 *s_local;
  
  rd_00 = extract32(insn,0,5);
  rn_00 = extract32(insn,5,5);
  imm4_00 = extract32(insn,0xb,4);
  uVar1 = extract32(insn,0x1d,1);
  is_q_00 = extract32(insn,0x1e,1);
  imm5_00 = extract32(insn,0x10,5);
  if (uVar1 == 0) {
    switch(imm4_00) {
    case 0:
      handle_simd_dupe(s,is_q_00,rd_00,rn_00,imm5_00);
      break;
    case 1:
      handle_simd_dupg(s,is_q_00,rd_00,rn_00,imm5_00);
      break;
    default:
      unallocated_encoding_aarch64(s);
      break;
    case 3:
      if (is_q_00 == 0) {
        unallocated_encoding_aarch64(s);
      }
      else {
        handle_simd_insg(s,rd_00,rn_00,imm5_00);
      }
      break;
    case 5:
    case 7:
      handle_simd_umov_smov(s,is_q_00,(uint)(imm4_00 == 5),rn_00,rd_00,imm5_00);
    }
  }
  else if (is_q_00 == 0) {
    unallocated_encoding_aarch64(s);
  }
  else {
    handle_simd_inse(s,rd_00,rn_00,imm4_00,imm5_00);
  }
  return;
}

Assistant:

static void disas_simd_copy(DisasContext *s, uint32_t insn)
{
    int rd = extract32(insn, 0, 5);
    int rn = extract32(insn, 5, 5);
    int imm4 = extract32(insn, 11, 4);
    int op = extract32(insn, 29, 1);
    int is_q = extract32(insn, 30, 1);
    int imm5 = extract32(insn, 16, 5);

    if (op) {
        if (is_q) {
            /* INS (element) */
            handle_simd_inse(s, rd, rn, imm4, imm5);
        } else {
            unallocated_encoding(s);
        }
    } else {
        switch (imm4) {
        case 0:
            /* DUP (element - vector) */
            handle_simd_dupe(s, is_q, rd, rn, imm5);
            break;
        case 1:
            /* DUP (general) */
            handle_simd_dupg(s, is_q, rd, rn, imm5);
            break;
        case 3:
            if (is_q) {
                /* INS (general) */
                handle_simd_insg(s, rd, rn, imm5);
            } else {
                unallocated_encoding(s);
            }
            break;
        case 5:
        case 7:
            /* UMOV/SMOV (is_q indicates 32/64; imm4 indicates signedness) */
            handle_simd_umov_smov(s, is_q, (imm4 == 5), rn, rd, imm5);
            break;
        default:
            unallocated_encoding(s);
            break;
        }
    }
}